

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiColumns *pIVar1;
  ImGuiColumns *v;
  ImGuiID in_ESI;
  long in_RDI;
  ImGuiColumns *columns;
  int n;
  undefined8 in_stack_ffffffffffffff38;
  ImVector<ImGuiColumns> *in_stack_ffffffffffffff40;
  ImGuiColumns *in_stack_ffffffffffffff60;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x2a0) <= local_18) {
      v = (ImGuiColumns *)(in_RDI + 0x2a0);
      pIVar1 = (ImGuiColumns *)&stack0xffffffffffffff60;
      ImGuiColumns::ImGuiColumns(in_stack_ffffffffffffff60);
      ImVector<ImGuiColumns>::push_back((ImVector<ImGuiColumns> *)pIVar1,v);
      ImGuiColumns::~ImGuiColumns(pIVar1);
      pIVar1 = ImVector<ImGuiColumns>::back((ImVector<ImGuiColumns> *)pIVar1);
      pIVar1->ID = in_ESI;
      return pIVar1;
    }
    pIVar1 = ImVector<ImGuiColumns>::operator[]
                       (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    if (pIVar1->ID == in_ESI) break;
    local_18 = local_18 + 1;
  }
  pIVar1 = ImVector<ImGuiColumns>::operator[]
                     (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  return pIVar1;
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}